

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable_list.h
# Opt level: O1

void __thiscall hittable_list::add(hittable_list *this,shared_ptr<hittable> *object)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (&this->objects,object);
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_40);
  dVar1 = (this->bbox).x.min;
  dVar2 = (this->bbox).x.max;
  uVar7 = -(ulong)(dVar1 <= local_40);
  uVar8 = -(ulong)(local_38 <= dVar2);
  dVar3 = (this->bbox).y.min;
  uVar9 = -(ulong)(dVar3 <= local_30);
  dVar4 = (this->bbox).y.max;
  uVar10 = -(ulong)(local_28 <= dVar4);
  dVar5 = (this->bbox).z.min;
  uVar11 = -(ulong)(dVar5 <= local_20);
  dVar6 = (this->bbox).z.max;
  uVar12 = -(ulong)(local_18 <= dVar6);
  (this->bbox).x.min = (double)(~uVar7 & (ulong)local_40 | (ulong)dVar1 & uVar7);
  (this->bbox).x.max = (double)(~uVar8 & (ulong)local_38 | (ulong)dVar2 & uVar8);
  (this->bbox).y.min = (double)(~uVar9 & (ulong)local_30 | (ulong)dVar3 & uVar9);
  (this->bbox).y.max = (double)(~uVar10 & (ulong)local_28 | (ulong)dVar4 & uVar10);
  (this->bbox).z.min = (double)(~uVar11 & (ulong)local_20 | (ulong)dVar5 & uVar11);
  (this->bbox).z.max = (double)(~uVar12 & (ulong)local_18 | (ulong)dVar6 & uVar12);
  return;
}

Assistant:

void add(shared_ptr<hittable> object) {
        objects.push_back(object);
        bbox = aabb(bbox, object->bounding_box());
    }